

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O3

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  undefined4 uVar1;
  UInt32 UVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  int iVar11;
  UInt32 UVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  UInt32 *pUVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  Int32 zztmp;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  Int32 zztmp_1;
  ulong uVar27;
  long lVar28;
  Int32 stackLo [100];
  Int32 ftab [257];
  Int32 ftabCopy [256];
  ulong local_bb8;
  ulong local_bb0;
  uint local_ba4;
  uint local_b68 [99];
  uint auStack_9dc [101];
  int local_848 [260];
  int local_438 [258];
  
  memset(local_848,0,0x404);
  uVar27 = (ulong)(uint)nblock;
  iVar14 = 0;
  if (0 < nblock) {
    uVar7 = 0;
    do {
      local_848[*(byte *)((long)eclass + uVar7)] = local_848[*(byte *)((long)eclass + uVar7)] + 1;
      uVar7 = uVar7 + 1;
      iVar14 = local_848[0];
    } while (uVar27 != uVar7);
  }
  memcpy(local_438,local_848,0x400);
  lVar8 = 1;
  do {
    iVar14 = iVar14 + local_848[lVar8];
    local_848[lVar8] = iVar14;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x101);
  if (0 < nblock) {
    uVar7 = 0;
    do {
      iVar14 = local_848[*(byte *)((long)eclass + uVar7)];
      local_848[*(byte *)((long)eclass + uVar7)] = iVar14 + -1;
      fmap[(long)iVar14 + -1] = (UInt32)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar27 != uVar7);
  }
  if (-0x40 < nblock) {
    iVar14 = nblock + 0x1f;
    if (-1 < nblock) {
      iVar14 = nblock;
    }
    memset(bhtab,0,(ulong)((iVar14 >> 5) + 1) * 4 + 4);
  }
  lVar8 = 0;
  do {
    bhtab[local_848[lVar8] >> 5] =
         bhtab[local_848[lVar8] >> 5] | 1 << ((byte)local_848[lVar8] & 0x1f);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  iVar14 = 0;
  do {
    bhtab[nblock + iVar14 >> 5] =
         bhtab[nblock + iVar14 >> 5] | 1 << ((byte)(nblock + iVar14) & 0x1f);
    iVar24 = nblock + 1 + iVar14;
    bVar4 = (byte)iVar24 & 0x1f;
    bhtab[iVar24 >> 5] = bhtab[iVar24 >> 5] & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
    iVar14 = iVar14 + 2;
  } while (iVar14 != 0x40);
  iVar14 = 1;
  do {
    if (0 < nblock) {
      uVar7 = 0;
      uVar25 = 0;
      do {
        if ((bhtab[uVar7 >> 5 & 0x7ffffff] >> ((uint)uVar7 & 0x1f) & 1) != 0) {
          uVar25 = uVar7 & 0xffffffff;
        }
        eclass[(int)(((int)(fmap[uVar7] - iVar14) >> 0x1f & nblock) + (fmap[uVar7] - iVar14))] =
             (UInt32)uVar25;
        uVar7 = uVar7 + 1;
      } while (uVar27 != uVar7);
    }
    uVar26 = 0;
    iVar24 = 0;
LAB_006dc6f7:
    uVar15 = uVar26 - 1;
    iVar11 = uVar26 - 0x20;
    do {
      uVar6 = uVar26;
      iVar13 = iVar11;
      uVar19 = uVar15;
      uVar5 = 1 << ((byte)uVar6 & 0x1f) & bhtab[(int)uVar6 >> 5];
      if ((uVar6 & 0x1f) == 0) break;
      uVar15 = uVar19 + 1;
      iVar11 = iVar13 + 1;
      uVar26 = uVar6 + 1;
    } while (uVar5 != 0);
    if (uVar5 != 0) {
      do {
        uVar6 = uVar19;
        iVar13 = iVar13 + 0x20;
        uVar19 = uVar6 + 0x20;
      } while (bhtab[iVar13 >> 5] == 0xffffffff);
      do {
        uVar6 = uVar6 + 1;
      } while ((bhtab[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0);
    }
    if ((int)uVar6 <= nblock) {
      uVar15 = uVar6 - 1;
      uVar19 = uVar15;
      uVar5 = uVar6;
      iVar11 = uVar6 - 0x20;
      do {
        iVar13 = iVar11;
        uVar26 = uVar5;
        uVar16 = uVar19;
        uVar21 = 1 << (sbyte)(uVar26 & 0x1f) & bhtab[(int)uVar26 >> 5];
        if ((uVar26 & 0x1f) == 0) break;
        uVar19 = uVar16 + 1;
        uVar5 = uVar26 + 1;
        iVar11 = iVar13 + 1;
      } while (uVar21 == 0);
      if (uVar21 == 0) {
        do {
          uVar26 = uVar16;
          iVar13 = iVar13 + 0x20;
          uVar16 = uVar26 + 0x20;
        } while (bhtab[iVar13 >> 5] == 0);
        do {
          uVar26 = uVar26 + 1;
        } while ((bhtab[(int)uVar26 >> 5] >> (uVar26 & 0x1f) & 1) == 0);
      }
      if (nblock < (int)uVar26) goto LAB_006dcc08;
      if ((int)uVar6 < (int)uVar26) {
        iVar24 = (iVar24 - uVar6) + uVar26 + 1;
        auStack_9dc[1] = uVar15;
        local_b68[0] = uVar26 - 1;
        local_bb0 = 1;
        local_ba4 = 0;
        do {
          uVar7 = local_bb0 & 0xffffffff;
          while( true ) {
            if (0x62 < uVar7) {
              bz_internal_error(0x3ec);
            }
            local_bb0 = uVar7 - 1;
            uVar6 = auStack_9dc[uVar7];
            lVar8 = (long)(int)uVar6;
            uVar19 = local_b68[uVar7 - 1];
            if (9 < (int)(uVar19 - uVar6)) break;
            if (uVar19 != uVar6) {
              lVar28 = (long)(int)uVar19;
              if ((int)uVar6 <= (int)(uVar19 - 4) && 3 < (int)(uVar19 - uVar6)) {
                lVar9 = lVar28;
                uVar25 = (long)(int)(uVar19 - 4);
                do {
                  UVar12 = fmap[uVar25];
                  if (lVar28 + -4 < (long)uVar25) {
                    uVar16 = (uint)uVar25;
                  }
                  else {
                    uVar5 = eclass[(int)UVar12];
                    uVar17 = uVar25 & 0xffffffff;
                    lVar23 = lVar9;
                    do {
                      uVar16 = (uint)uVar17;
                      if (uVar5 <= eclass[fmap[lVar23]]) break;
                      fmap[(int)uVar16] = fmap[lVar23];
                      lVar23 = lVar23 + 4;
                      uVar16 = uVar16 + 4;
                      uVar17 = (ulong)uVar16;
                    } while (lVar23 <= lVar28);
                  }
                  fmap[(int)uVar16] = UVar12;
                  lVar9 = lVar9 + -1;
                  bVar3 = lVar8 < (long)uVar25;
                  uVar25 = uVar25 - 1;
                } while (bVar3);
              }
              if ((int)uVar6 < (int)uVar19) {
                iVar11 = -uVar19;
                pUVar18 = fmap + lVar28;
                iVar13 = 1;
                lVar9 = lVar28;
                do {
                  UVar12 = fmap[lVar9 + -1];
                  iVar22 = (int)lVar9;
                  if (lVar9 <= lVar28) {
                    uVar6 = eclass[(int)UVar12];
                    lVar23 = 0;
                    do {
                      if (uVar6 <= eclass[pUVar18[lVar23]]) {
                        iVar22 = (int)lVar23 - iVar11;
                        break;
                      }
                      pUVar18[lVar23 + -1] = pUVar18[lVar23];
                      lVar23 = lVar23 + 1;
                      iVar22 = uVar19 + 1;
                    } while (iVar13 != (int)lVar23);
                  }
                  lVar9 = lVar9 + -1;
                  fmap[(long)iVar22 + -1] = UVar12;
                  iVar11 = iVar11 + 1;
                  iVar13 = iVar13 + 1;
                  pUVar18 = pUVar18 + -1;
                } while (lVar8 < lVar9);
              }
            }
            bVar3 = (long)uVar7 < 2;
            uVar7 = local_bb0;
            if (bVar3) goto LAB_006dcbbe;
          }
          local_ba4 = local_ba4 * 0x1dc5 + 1 & 0x7fff;
          uVar5 = uVar6;
          if (((short)(local_ba4 % 3) != 0) && (uVar5 = uVar19, local_ba4 % 3 == 1)) {
            uVar5 = (int)(uVar19 + uVar6) >> 1;
          }
          UVar12 = eclass[fmap[(int)uVar5]];
          local_bb8 = (ulong)uVar19;
          uVar25 = (ulong)uVar6;
          uVar5 = uVar19;
          uVar16 = uVar6;
LAB_006dc9aa:
          uVar21 = uVar16;
          if ((int)uVar16 <= (int)uVar5) {
            uVar25 = (ulong)(int)uVar25;
            do {
              lVar28 = (long)(int)uVar16 + -1;
              uVar21 = uVar16;
              while( true ) {
                uVar20 = fmap[lVar28 + 1];
                UVar2 = eclass[uVar20];
                if (UVar2 == UVar12) break;
                if (UVar2 != UVar12 && (int)UVar12 <= (int)UVar2) goto LAB_006dca19;
                uVar21 = uVar21 + 1;
                lVar28 = lVar28 + 1;
                if ((int)uVar5 <= lVar28) {
                  if ((int)uVar16 <= (int)uVar5) {
                    uVar16 = uVar5;
                  }
                  uVar21 = uVar16 + 1;
                  goto LAB_006dca19;
                }
              }
              fmap[lVar28 + 1] = fmap[uVar25];
              fmap[uVar25] = uVar20;
              uVar25 = uVar25 + 1;
              uVar16 = uVar21 + 1;
            } while ((int)uVar21 < (int)uVar5);
            uVar21 = uVar21 + 1;
          }
LAB_006dca19:
          lVar28 = (long)(int)uVar21;
          if ((int)uVar21 <= (int)uVar5) {
            local_bb8 = (ulong)(int)local_bb8;
            do {
              lVar9 = (long)(int)uVar5 + 1;
              uVar20 = uVar5;
              while( true ) {
                uVar16 = fmap[lVar9 + -1];
                if (eclass[uVar16] == UVar12) break;
                if ((int)eclass[uVar16] < (int)UVar12) {
                  UVar2 = fmap[lVar28];
                  fmap[lVar28] = uVar16;
                  fmap[lVar9 + -1] = UVar2;
                  uVar16 = uVar21 + 1;
                  uVar5 = uVar20 - 1;
                  goto LAB_006dc9aa;
                }
                lVar9 = lVar9 + -1;
                uVar20 = uVar20 - 1;
                if (lVar9 <= lVar28) {
                  uVar20 = uVar5;
                  if (lVar28 <= (int)uVar5) {
                    uVar20 = uVar21;
                  }
                  goto LAB_006dcab1;
                }
              }
              fmap[lVar9 + -1] = fmap[local_bb8];
              fmap[local_bb8] = uVar16;
              local_bb8 = local_bb8 - 1;
              uVar5 = uVar20 - 1;
            } while ((int)uVar21 < (int)uVar20);
LAB_006dcab1:
            uVar5 = uVar20 - 1;
          }
          uVar16 = (uint)uVar25;
          if ((int)uVar16 <= (int)local_bb8) {
            iVar11 = uVar21 - uVar16;
            if ((int)(uVar16 - uVar6) < (int)(uVar21 - uVar16)) {
              iVar11 = uVar16 - uVar6;
            }
            if (0 < iVar11) {
              uVar20 = iVar11 + 1;
              lVar9 = 0;
              do {
                uVar1 = *(undefined4 *)((long)fmap + lVar9 + lVar8 * 4);
                *(undefined4 *)((long)fmap + lVar9 + lVar8 * 4) =
                     *(undefined4 *)((long)fmap + lVar9 + (long)(int)(uVar21 - iVar11) * 4);
                *(undefined4 *)((long)fmap + lVar9 + (long)(int)(uVar21 - iVar11) * 4) = uVar1;
                lVar9 = lVar9 + 4;
                uVar20 = uVar20 - 1;
              } while (1 < uVar20);
            }
            iVar13 = (int)local_bb8 - uVar5;
            iVar11 = uVar19 - (int)local_bb8;
            if (iVar13 <= (int)(uVar19 - (int)local_bb8)) {
              iVar11 = iVar13;
            }
            if (0 < iVar11) {
              uVar5 = iVar11 + 1;
              pUVar18 = fmap;
              do {
                UVar12 = pUVar18[lVar28];
                pUVar18[lVar28] = pUVar18[(long)(int)(uVar19 - iVar11) + 1];
                pUVar18[(long)(int)(uVar19 - iVar11) + 1] = UVar12;
                pUVar18 = pUVar18 + 1;
                uVar5 = uVar5 - 1;
              } while (1 < uVar5);
            }
            uVar5 = uVar6 + ~uVar16 + uVar21;
            uVar20 = (uVar19 - iVar13) + 1;
            if ((int)(uVar19 - uVar20) < (int)(~uVar16 + uVar21)) {
              local_b68[local_bb0] = uVar5;
              uVar5 = uVar19;
              uVar6 = uVar20;
            }
            else {
              auStack_9dc[uVar7] = uVar20;
            }
            auStack_9dc[(uVar7 & 0xffffffff) + 1] = uVar6;
            local_b68[uVar7 & 0xffffffff] = uVar5;
            local_bb0 = (ulong)((int)uVar7 + 1);
          }
        } while (0 < (int)local_bb0);
LAB_006dcbbe:
        puVar10 = fmap + (int)uVar15;
        UVar12 = 0xffffffff;
        do {
          UVar2 = eclass[*puVar10];
          if (UVar12 != UVar2) {
            bhtab[(int)uVar15 >> 5] = bhtab[(int)uVar15 >> 5] | 1 << ((byte)uVar15 & 0x1f);
            UVar12 = UVar2;
          }
          uVar15 = uVar15 + 1;
          puVar10 = puVar10 + 1;
        } while (uVar26 != uVar15);
      }
      goto LAB_006dc6f7;
    }
LAB_006dcc08:
    iVar14 = iVar14 * 2;
    if ((nblock < iVar14) || (iVar24 == 0)) {
      if (0 < nblock) {
        uVar7 = 0;
        lVar8 = 0;
        do {
          lVar8 = (long)(int)lVar8 + -1;
          do {
            lVar28 = lVar8 + 1;
            lVar8 = lVar8 + 1;
          } while (local_438[lVar28] == 0);
          local_438[lVar8] = local_438[lVar28] + -1;
          *(char *)((long)eclass + (ulong)fmap[uVar7]) = (char)lVar8;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar27);
        if (0xff < lVar8) {
          bz_internal_error(0x3ed);
          return;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}